

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::prepareProgramPipeline
          (FunctionalTest20_21 *this,GLuint *out_pipeline_id,program **programs)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6d8))(1,out_pipeline_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GenProgramPipelines",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x289d);
  (**(code **)(lVar3 + 0x98))(*out_pipeline_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindProgramPipeline",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x28a1);
  (**(code **)(lVar3 + 0x1688))(*out_pipeline_id,2,(*programs)->m_program_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"UseProgramStages",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x28a5);
  (**(code **)(lVar3 + 0x1688))(*out_pipeline_id,4,programs[1]->m_program_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"UseProgramStages",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x28a8);
  (**(code **)(lVar3 + 0x1688))(*out_pipeline_id,8,programs[2]->m_program_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"UseProgramStages",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x28ac);
  (**(code **)(lVar3 + 0x1688))(*out_pipeline_id,0x10,programs[3]->m_program_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"UseProgramStages",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x28b0);
  (**(code **)(lVar3 + 0x1688))(*out_pipeline_id,1,programs[4]->m_program_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"UseProgramStages",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x28b3);
  return;
}

Assistant:

void FunctionalTest20_21::prepareProgramPipeline(glw::GLuint& out_pipeline_id, Utils::program** programs)
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate */
	gl.genProgramPipelines(1, &out_pipeline_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenProgramPipelines");

	/* Bind */
	gl.bindProgramPipeline(out_pipeline_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindProgramPipeline");

	/* Set up programs */
	gl.useProgramStages(out_pipeline_id, GL_FRAGMENT_SHADER_BIT, programs[m_fragment_stage_index]->m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages");

	gl.useProgramStages(out_pipeline_id, GL_GEOMETRY_SHADER_BIT, programs[m_geometry_stage_index]->m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages");

	gl.useProgramStages(out_pipeline_id, GL_TESS_CONTROL_SHADER_BIT,
						programs[m_tesselation_control_stage_index]->m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages");

	gl.useProgramStages(out_pipeline_id, GL_TESS_EVALUATION_SHADER_BIT,
						programs[m_tesselation_evaluation_stage_index]->m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages");

	gl.useProgramStages(out_pipeline_id, GL_VERTEX_SHADER_BIT, programs[m_vertex_stage_index]->m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages");
}